

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O3

bool vkt::api::anon_unknown_0::executeCommandBuffer
               (VkDevice device,DeviceInterface *vk,VkQueue queue,VkCommandBuffer commandBuffer,
               bool exitBeforeEndCommandBuffer)

{
  Handle<(vk::HandleType)10> HVar1;
  VkResult VVar2;
  int iVar3;
  bool bVar4;
  VkSubmitInfo submitInfo;
  VkCommandBufferBeginInfo commandBufferBeginInfo;
  VkCommandBuffer local_f0;
  VkFence local_e8;
  Deleter<vk::Handle<(vk::HandleType)6>_> DStack_e0;
  VkEvent local_c8;
  Deleter<vk::Handle<(vk::HandleType)10>_> DStack_c0;
  Move<vk::Handle<(vk::HandleType)10>_> local_a8;
  undefined8 local_88;
  undefined8 uStack_80;
  VkCommandBuffer *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_f0 = commandBuffer;
  ::vk::createEvent(&local_a8,vk,device,0,(VkAllocationCallbacks *)0x0);
  DStack_c0.m_device._0_4_ =
       local_a8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device._0_4_;
  DStack_c0.m_device._4_4_ =
       local_a8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device._4_4_;
  DStack_c0.m_allocator._0_4_ =
       local_a8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator._0_4_;
  DStack_c0.m_allocator._4_4_ =
       local_a8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator._4_4_;
  local_c8.m_internal =
       local_a8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal;
  DStack_c0.m_deviceIface =
       local_a8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_deviceIface;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0x2a;
  uStack_54 = 0;
  uStack_50 = 0;
  uStack_4c = 0;
  VVar2 = (*vk->_vptr_DeviceInterface[0x49])(vk,commandBuffer);
  ::vk::checkResult(VVar2,"vk.beginCommandBuffer(commandBuffer, &commandBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x260);
  (*vk->_vptr_DeviceInterface[0x6a])(vk,commandBuffer,local_c8.m_internal,0x10000);
  bVar4 = true;
  if (!exitBeforeEndCommandBuffer) {
    VVar2 = (*vk->_vptr_DeviceInterface[0x4a])(vk,commandBuffer);
    ::vk::checkResult(VVar2,"vk.endCommandBuffer(commandBuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                      ,0x267);
    ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&local_a8,vk,device,0,
                      (VkAllocationCallbacks *)0x0);
    HVar1.m_internal =
         local_a8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal;
    DStack_e0.m_device._0_4_ =
         local_a8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device._0_4_;
    DStack_e0.m_device._4_4_ =
         local_a8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device._4_4_;
    DStack_e0.m_allocator._0_4_ =
         local_a8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator._0_4_;
    DStack_e0.m_allocator._4_4_ =
         local_a8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator._4_4_;
    local_e8.m_internal =
         local_a8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal;
    DStack_e0.m_deviceIface =
         local_a8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_deviceIface;
    local_a8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_88 = 0;
    uStack_70 = 0;
    local_a8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device = (VkDevice)0x0;
    local_a8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    local_68 = 0;
    local_a8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal = 4;
    uStack_80 = 1;
    local_78 = &local_f0;
    VVar2 = (*vk->_vptr_DeviceInterface[2])(vk,queue,1,&local_a8,HVar1.m_internal);
    ::vk::checkResult(VVar2,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                      ,0x279);
    VVar2 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&local_e8,0,0xffffffffffffffff);
    ::vk::checkResult(VVar2,"vk.waitForFences(device, 1u, &fence.get(), 0u, INFINITE_TIMEOUT)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                      ,0x27b);
    if (local_e8.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()(&DStack_e0,local_e8);
    }
    iVar3 = (*vk->_vptr_DeviceInterface[0x1b])(vk,device,local_c8.m_internal);
    bVar4 = iVar3 == 3;
  }
  if (local_c8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)10>_>::operator()(&DStack_c0,local_c8);
  }
  return bVar4;
}

Assistant:

bool executeCommandBuffer (const VkDevice			device,
						   const DeviceInterface&	vk,
						   const VkQueue			queue,
						   const VkCommandBuffer	commandBuffer,
						   const bool				exitBeforeEndCommandBuffer = false)
{
	const Unique<VkEvent>			event					(createEvent(vk, device));
	const VkCommandBufferBeginInfo	commandBufferBeginInfo	=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	//VkStructureType						sType;
		DE_NULL,										//const void*							pNext;
		0u,												//VkCommandBufferUsageFlags				flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL	//const VkCommandBufferInheritanceInfo*	pInheritanceInfo;
	};

	VK_CHECK(vk.beginCommandBuffer(commandBuffer, &commandBufferBeginInfo));
	{
		const VkPipelineStageFlags stageMask = VK_PIPELINE_STAGE_ALL_COMMANDS_BIT;
		vk.cmdSetEvent(commandBuffer, *event, stageMask);
		if (exitBeforeEndCommandBuffer)
			return exitBeforeEndCommandBuffer;
	}
	VK_CHECK(vk.endCommandBuffer(commandBuffer));

	{
		const Unique<VkFence>					fence			(createFence(vk, device));
		const VkSubmitInfo						submitInfo		=
		{
			VK_STRUCTURE_TYPE_SUBMIT_INFO,			// sType
			DE_NULL,								// pNext
			0u,										// waitSemaphoreCount
			DE_NULL,								// pWaitSemaphores
			(const VkPipelineStageFlags*)DE_NULL,	// pWaitDstStageMask
			1u,										// commandBufferCount
			&commandBuffer,							// pCommandBuffers
			0u,										// signalSemaphoreCount
			DE_NULL									// pSignalSemaphores
		};

		// Submit the command buffer to the queue
		VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));
		// wait for end of execution of queue
		VK_CHECK(vk.waitForFences(device, 1u, &fence.get(), 0u, INFINITE_TIMEOUT));
	}
	// check if buffer has been executed
	const VkResult result = vk.getEventStatus(device, *event);
	return result == VK_EVENT_SET;
}